

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTryRunCommand.cxx
# Opt level: O0

void __thiscall
cmTryRunCommand::DoNotRunExecutable
          (cmTryRunCommand *this,string *runArgs,string *srcFile,string *out)

{
  cmMakefile *pcVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  _Ios_Openmode _Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  allocator local_4e1;
  string local_4e0 [8];
  string errorMessage;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  allocator local_439;
  undefined1 local_438 [8];
  string comment_2;
  ofstream file;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  char *local_1c8;
  char *existing;
  cmState *state_1;
  string comment_1;
  string local_190;
  allocator local_169;
  string local_168;
  char *local_148;
  char *existingValue;
  cmState *state;
  string comment;
  undefined1 local_110 [7];
  bool error;
  string internalRunOutputName;
  string local_e8 [8];
  string detailsString;
  string local_c0 [8];
  string resultFileName;
  string local_80;
  allocator local_49;
  undefined1 local_48 [8];
  string copyDest;
  string *out_local;
  string *srcFile_local;
  string *runArgs_local;
  cmTryRunCommand *this_local;
  
  copyDest.field_2._8_8_ = out;
  pcVar3 = cmMakefile::GetHomeOutputDirectory
                     ((this->super_cmCoreTryCompile).super_cmCommand.Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_48,pcVar3,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  pcVar3 = cmake::GetCMakeFilesDirectory();
  std::__cxx11::string::operator+=((string *)local_48,pcVar3);
  std::__cxx11::string::operator+=((string *)local_48,"/");
  cmsys::SystemTools::GetFilenameWithoutExtension
            (&local_80,&(this->super_cmCoreTryCompile).OutputFile);
  std::__cxx11::string::operator+=((string *)local_48,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::operator+=((string *)local_48,"-");
  std::__cxx11::string::operator+=((string *)local_48,(string *)&this->RunResultVariable);
  cmsys::SystemTools::GetFilenameExtension
            ((string *)((long)&resultFileName.field_2 + 8),
             &(this->super_cmCoreTryCompile).OutputFile);
  std::__cxx11::string::operator+=
            ((string *)local_48,(string *)(resultFileName.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(resultFileName.field_2._M_local_buf + 8));
  cmsys::SystemTools::CopyFileAlways(&(this->super_cmCoreTryCompile).OutputFile,(string *)local_48);
  pcVar3 = cmMakefile::GetHomeOutputDirectory
                     ((this->super_cmCoreTryCompile).super_cmCommand.Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c0,pcVar3,(allocator *)(detailsString.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(detailsString.field_2._M_local_buf + 0xf));
  std::__cxx11::string::operator+=(local_c0,"/TryRunResults.cmake");
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e8,"For details see ",
             (allocator *)(internalRunOutputName.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(internalRunOutputName.field_2._M_local_buf + 0xf));
  std::__cxx11::string::operator+=(local_e8,local_c0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                 &this->RunResultVariable,"__TRYRUN_OUTPUT");
  comment.field_2._M_local_buf[0xf] = '\0';
  pcVar3 = cmMakefile::GetDefinition
                     ((this->super_cmCoreTryCompile).super_cmCommand.Makefile,
                      &this->RunResultVariable);
  if (pcVar3 == (char *)0x0) {
    std::__cxx11::string::string((string *)&state);
    std::__cxx11::string::operator+=
              ((string *)&state,
               "Run result of TRY_RUN(), indicates whether the executable would have been able to run on its target platform.\n"
              );
    std::__cxx11::string::operator+=((string *)&state,local_e8);
    pcVar1 = (this->super_cmCoreTryCompile).super_cmCommand.Makefile;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddCacheDefinition
              (pcVar1,&this->RunResultVariable,"PLEASE_FILL_OUT-FAILED_TO_RUN",pcVar3,STRING,false);
    existingValue =
         (char *)cmMakefile::GetState((this->super_cmCoreTryCompile).super_cmCommand.Makefile);
    local_148 = cmState::GetCacheEntryValue((cmState *)existingValue,&this->RunResultVariable);
    pcVar3 = existingValue;
    if (local_148 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_168,"ADVANCED",&local_169);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_190,"1",(allocator *)(comment_1.field_2._M_local_buf + 0xf));
      cmState::SetCacheEntryProperty
                ((cmState *)pcVar3,&this->RunResultVariable,&local_168,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator((allocator<char> *)(comment_1.field_2._M_local_buf + 0xf));
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator((allocator<char> *)&local_169);
    }
    comment.field_2._M_local_buf[0xf] = '\x01';
    std::__cxx11::string::~string((string *)&state);
  }
  if ((copyDest.field_2._8_8_ != 0) &&
     (pcVar3 = cmMakefile::GetDefinition
                         ((this->super_cmCoreTryCompile).super_cmCommand.Makefile,
                          (string *)local_110), pcVar3 == (char *)0x0)) {
    std::__cxx11::string::string((string *)&state_1);
    std::__cxx11::string::operator+=
              ((string *)&state_1,
               "Output of TRY_RUN(), contains the text, which the executable would have printed on stdout and stderr on its target platform.\n"
              );
    std::__cxx11::string::operator+=((string *)&state_1,local_e8);
    pcVar1 = (this->super_cmCoreTryCompile).super_cmCommand.Makefile;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddCacheDefinition
              (pcVar1,(string *)local_110,"PLEASE_FILL_OUT-NOTFOUND",pcVar3,STRING,false);
    existing = (char *)cmMakefile::GetState((this->super_cmCoreTryCompile).super_cmCommand.Makefile)
    ;
    local_1c8 = cmState::GetCacheEntryValue((cmState *)existing,(string *)local_110);
    pcVar3 = existing;
    if (local_1c8 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1e8,"ADVANCED",&local_1e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_210,"1",(allocator *)&file.field_0x1ff);
      cmState::SetCacheEntryProperty((cmState *)pcVar3,(string *)local_110,&local_1e8,&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator((allocator<char> *)&file.field_0x1ff);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    }
    comment.field_2._M_local_buf[0xf] = '\x01';
    std::__cxx11::string::~string((string *)&state_1);
  }
  if ((comment.field_2._M_local_buf[0xf] & 1U) == 0) {
    if (copyDest.field_2._8_8_ != 0) {
      pcVar3 = cmMakefile::GetDefinition
                         ((this->super_cmCoreTryCompile).super_cmCommand.Makefile,
                          (string *)local_110);
      std::__cxx11::string::operator=((string *)copyDest.field_2._8_8_,pcVar3);
    }
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    _Var5 = _S_app;
    if ((DoNotRunExecutable::firstTryRun & 1U) != 0) {
      _Var5 = _S_out;
    }
    std::ofstream::ofstream((void *)((long)&comment_2.field_2 + 8),pcVar3,_Var5);
    bVar2 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&comment_2.field_2 +
                              *(long *)(comment_2.field_2._8_8_ + -0x18) + 8));
    if (bVar2) {
      if ((DoNotRunExecutable::firstTryRun & 1U) != 0) {
        std::operator<<((ostream *)((long)&comment_2.field_2 + 8),
                        "# This file was generated by CMake because it detected TRY_RUN() commands\n# in crosscompiling mode. It will be overwritten by the next CMake run.\n# Copy it to a safe location, set the variables to appropriate values\n# and use it then to preset the CMake cache (using -C).\n\n"
                       );
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_438,"\n",&local_439);
      std::allocator<char>::~allocator((allocator<char> *)&local_439);
      std::__cxx11::string::operator+=((string *)local_438,(string *)&this->RunResultVariable);
      std::__cxx11::string::operator+=
                ((string *)local_438,
                 "\n   indicates whether the executable would have been able to run on its\n   target platform. If so, set "
                );
      std::__cxx11::string::operator+=((string *)local_438,(string *)&this->RunResultVariable);
      std::__cxx11::string::operator+=
                ((string *)local_438,
                 " to\n   the exit code (in many cases 0 for success), otherwise enter \"FAILED_TO_RUN\".\n"
                );
      if (copyDest.field_2._8_8_ != 0) {
        std::__cxx11::string::operator+=((string *)local_438,(string *)local_110);
        std::__cxx11::string::operator+=
                  ((string *)local_438,
                   "\n   contains the text the executable would have printed on stdout and stderr.\n   If the executable would not have been able to run, set "
                  );
        std::__cxx11::string::operator+=((string *)local_438,(string *)local_110);
        std::__cxx11::string::operator+=
                  ((string *)local_438,
                   " empty.\n   Otherwise check if the output is evaluated by the calling CMake code. If so,\n   check what the source file would have printed when called with the given arguments.\n"
                  );
      }
      std::__cxx11::string::operator+=((string *)local_438,"The ");
      std::__cxx11::string::operator+=((string *)local_438,(string *)&this->CompileResultVariable);
      std::__cxx11::string::operator+=
                ((string *)local_438,
                 " variable holds the build result for this TRY_RUN().\n\nSource file   : ");
      std::operator+(&local_460,srcFile,"\n");
      std::__cxx11::string::operator+=((string *)local_438,(string *)&local_460);
      std::__cxx11::string::~string((string *)&local_460);
      std::__cxx11::string::operator+=((string *)local_438,"Executable    : ");
      std::operator+(&local_480,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     "\n");
      std::__cxx11::string::operator+=((string *)local_438,(string *)&local_480);
      std::__cxx11::string::~string((string *)&local_480);
      std::__cxx11::string::operator+=((string *)local_438,"Run arguments : ");
      std::__cxx11::string::operator+=((string *)local_438,(string *)runArgs);
      std::__cxx11::string::operator+=((string *)local_438,"\n");
      cmMakefile::FormatListFileStack_abi_cxx11_
                ((string *)((long)&errorMessage.field_2 + 8),
                 (this->super_cmCoreTryCompile).super_cmCommand.Makefile);
      std::operator+(&local_4a0,"   Called from: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&errorMessage.field_2 + 8));
      std::__cxx11::string::operator+=((string *)local_438,(string *)&local_4a0);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::__cxx11::string::~string((string *)(errorMessage.field_2._M_local_buf + 8));
      cmsys::SystemTools::ReplaceString((string *)local_438,"\n","\n# ");
      poVar4 = std::operator<<((ostream *)((long)&comment_2.field_2 + 8),(string *)local_438);
      std::operator<<(poVar4,"\n\n");
      poVar4 = std::operator<<((ostream *)((long)&comment_2.field_2 + 8),"set( ");
      poVar4 = std::operator<<(poVar4,(string *)&this->RunResultVariable);
      poVar4 = std::operator<<(poVar4," \n     \"");
      pcVar3 = cmMakefile::GetDefinition
                         ((this->super_cmCoreTryCompile).super_cmCommand.Makefile,
                          &this->RunResultVariable);
      poVar4 = std::operator<<(poVar4,pcVar3);
      std::operator<<(poVar4,"\"\n     CACHE STRING \"Result from TRY_RUN\" FORCE)\n\n");
      if (copyDest.field_2._8_8_ != 0) {
        poVar4 = std::operator<<((ostream *)((long)&comment_2.field_2 + 8),"set( ");
        poVar4 = std::operator<<(poVar4,(string *)local_110);
        poVar4 = std::operator<<(poVar4," \n     \"");
        pcVar3 = cmMakefile::GetDefinition
                           ((this->super_cmCoreTryCompile).super_cmCommand.Makefile,
                            (string *)local_110);
        poVar4 = std::operator<<(poVar4,pcVar3);
        std::operator<<(poVar4,"\"\n     CACHE STRING \"Output from TRY_RUN\" FORCE)\n\n");
      }
      std::ofstream::close();
      std::__cxx11::string::~string((string *)local_438);
    }
    DoNotRunExecutable::firstTryRun = false;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_4e0,
               "TRY_RUN() invoked in cross-compiling mode, please set the following cache variables appropriately:\n"
               ,&local_4e1);
    std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
    std::operator+(&local_528,"   ",&this->RunResultVariable);
    std::operator+(&local_508,&local_528," (advanced)\n");
    std::__cxx11::string::operator+=(local_4e0,(string *)&local_508);
    std::__cxx11::string::~string((string *)&local_508);
    std::__cxx11::string::~string((string *)&local_528);
    if (copyDest.field_2._8_8_ != 0) {
      std::operator+(&local_568,"   ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110)
      ;
      std::operator+(&local_548,&local_568," (advanced)\n");
      std::__cxx11::string::operator+=(local_4e0,(string *)&local_548);
      std::__cxx11::string::~string((string *)&local_548);
      std::__cxx11::string::~string((string *)&local_568);
    }
    std::__cxx11::string::operator+=(local_4e0,local_e8);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::Error(pcVar3,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::string::~string(local_4e0);
    std::ofstream::~ofstream((void *)((long)&comment_2.field_2 + 8));
  }
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmTryRunCommand::DoNotRunExecutable(const std::string& runArgs,
                                    const std::string& srcFile,
                                    std::string* out
                                    )
{
  // copy the executable out of the CMakeFiles/ directory, so it is not
  // removed at the end of TRY_RUN and the user can run it manually
  // on the target platform.
  std::string copyDest =  this->Makefile->GetHomeOutputDirectory();
  copyDest += cmake::GetCMakeFilesDirectory();
  copyDest += "/";
  copyDest += cmSystemTools::GetFilenameWithoutExtension(
                                                     this->OutputFile);
  copyDest += "-";
  copyDest += this->RunResultVariable;
  copyDest += cmSystemTools::GetFilenameExtension(this->OutputFile);
  cmSystemTools::CopyFileAlways(this->OutputFile, copyDest);

  std::string resultFileName =  this->Makefile->GetHomeOutputDirectory();
  resultFileName += "/TryRunResults.cmake";

  std::string detailsString = "For details see ";
  detailsString += resultFileName;

  std::string internalRunOutputName=this->RunResultVariable+"__TRYRUN_OUTPUT";
  bool error = false;

  if (this->Makefile->GetDefinition(this->RunResultVariable) == 0)
    {
    // if the variables doesn't exist, create it with a helpful error text
    // and mark it as advanced
    std::string comment;
    comment += "Run result of TRY_RUN(), indicates whether the executable "
               "would have been able to run on its target platform.\n";
    comment += detailsString;
    this->Makefile->AddCacheDefinition(this->RunResultVariable,
                                       "PLEASE_FILL_OUT-FAILED_TO_RUN",
                                       comment.c_str(),
                                       cmState::STRING);

    cmState* state = this->Makefile->GetState();
    const char* existingValue
                        = state->GetCacheEntryValue(this->RunResultVariable);
    if (existingValue)
      {
      state->SetCacheEntryProperty(this->RunResultVariable, "ADVANCED", "1");
      }

    error = true;
    }

  // is the output from the executable used ?
  if (out!=0)
    {
    if (this->Makefile->GetDefinition(internalRunOutputName) == 0)
      {
      // if the variables doesn't exist, create it with a helpful error text
      // and mark it as advanced
      std::string comment;
      comment+="Output of TRY_RUN(), contains the text, which the executable "
           "would have printed on stdout and stderr on its target platform.\n";
      comment += detailsString;

      this->Makefile->AddCacheDefinition(internalRunOutputName,
                                         "PLEASE_FILL_OUT-NOTFOUND",
                                         comment.c_str(),
                                         cmState::STRING);
      cmState* state = this->Makefile->GetState();
      const char* existing =
          state->GetCacheEntryValue(internalRunOutputName);
      if (existing)
        {
        state->SetCacheEntryProperty(internalRunOutputName,
                                      "ADVANCED", "1");
        }

      error = true;
      }
    }

  if (error)
    {
    static bool firstTryRun = true;
    cmsys::ofstream file(resultFileName.c_str(),
                                  firstTryRun ? std::ios::out : std::ios::app);
    if ( file )
      {
      if (firstTryRun)
        {
        file << "# This file was generated by CMake because it detected "
                "TRY_RUN() commands\n"
                "# in crosscompiling mode. It will be overwritten by the next "
                "CMake run.\n"
                "# Copy it to a safe location, set the variables to "
                "appropriate values\n"
                "# and use it then to preset the CMake cache (using -C).\n\n";
        }

      std::string comment ="\n";
      comment += this->RunResultVariable;
      comment += "\n   indicates whether the executable would have been able "
                 "to run on its\n"
                 "   target platform. If so, set ";
      comment += this->RunResultVariable;
      comment += " to\n"
                 "   the exit code (in many cases 0 for success), otherwise "
                 "enter \"FAILED_TO_RUN\".\n";
      if (out!=0)
        {
        comment += internalRunOutputName;
        comment += "\n   contains the text the executable "
                   "would have printed on stdout and stderr.\n"
                  "   If the executable would not have been able to run, set ";
        comment += internalRunOutputName;
        comment += " empty.\n"
                   "   Otherwise check if the output is evaluated by the "
                   "calling CMake code. If so,\n"
                   "   check what the source file would have printed when "
                   "called with the given arguments.\n";
        }
      comment += "The ";
      comment += this->CompileResultVariable;
      comment += " variable holds the build result for this TRY_RUN().\n\n"
                 "Source file   : ";
      comment += srcFile + "\n";
      comment += "Executable    : ";
      comment += copyDest + "\n";
      comment += "Run arguments : ";
      comment += runArgs;
      comment += "\n";
      comment += "   Called from: " + this->Makefile->FormatListFileStack();
      cmsys::SystemTools::ReplaceString(comment, "\n", "\n# ");
      file << comment << "\n\n";

      file << "set( " << this->RunResultVariable << " \n     \""
           << this->Makefile->GetDefinition(this->RunResultVariable)
           << "\"\n     CACHE STRING \"Result from TRY_RUN\" FORCE)\n\n";

      if (out!=0)
        {
        file << "set( " << internalRunOutputName << " \n     \""
             << this->Makefile->GetDefinition(internalRunOutputName)
             << "\"\n     CACHE STRING \"Output from TRY_RUN\" FORCE)\n\n";
        }
      file.close();
      }
    firstTryRun = false;

    std::string errorMessage = "TRY_RUN() invoked in cross-compiling mode, "
                               "please set the following cache variables "
                               "appropriately:\n";
    errorMessage += "   " + this->RunResultVariable + " (advanced)\n";
    if (out!=0)
      {
      errorMessage += "   " + internalRunOutputName + " (advanced)\n";
      }
    errorMessage += detailsString;
    cmSystemTools::Error(errorMessage.c_str());
    return;
    }

  if (out!=0)
    {
    (*out) = this->Makefile->GetDefinition(internalRunOutputName);
    }
}